

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O1

void Fra_BmcFilterImplications(Fra_Man_t *p,Fra_Bmc_t *pBmc)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint fComplL;
  ulong uVar7;
  ulong uVar8;
  Aig_Obj_t *pNew;
  long lVar9;
  Aig_Obj_t *pOld;
  uint uVar10;
  Vec_Int_t *vImps;
  uint fComplR;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  
  if (p->nFramesAll != 1) {
    __assert_fail("p->nFramesAll == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                  ,0x80,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
  }
  if (p->pManAig != pBmc->pAigFrames) {
    __assert_fail("p->pManAig == pBmc->pAigFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                  ,0x81,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
  }
  vImps = pBmc->vImps;
  if (0 < vImps->nSize) {
    lVar13 = 0;
    do {
      uVar5 = vImps->pArray[lVar13];
      if (uVar5 != 0) {
        pVVar1 = pBmc->pAig->vObjs;
        if (pVVar1 == (Vec_Ptr_t *)0x0) {
          pvVar11 = (void *)0x0;
        }
        else {
          if (pVVar1->nSize <= (int)(uVar5 & 0xffff)) goto LAB_005ee3aa;
          pvVar11 = pVVar1->pArray[(ushort)uVar5];
        }
        if (pVVar1 == (Vec_Ptr_t *)0x0) {
          pvVar12 = (void *)0x0;
        }
        else {
          uVar5 = (int)uVar5 >> 0x10;
          if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) {
LAB_005ee3aa:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar12 = pVVar1->pArray[uVar5];
        }
        for (lVar9 = (long)pBmc->nPref; (int)lVar9 < pBmc->nFramesAll; lVar9 = lVar9 + 1) {
          lVar2 = *(long *)(*(long *)((long)pvVar11 + 0x28) + 0x40);
          uVar3 = *(ulong *)(*(long *)(lVar2 + 0x30) +
                            ((long)*(int *)((long)pvVar11 + 0x24) * (long)*(int *)(lVar2 + 8) +
                            lVar9) * 8);
          lVar2 = *(long *)(*(long *)((long)pvVar12 + 0x28) + 0x40);
          uVar4 = *(ulong *)(*(long *)(lVar2 + 0x30) +
                            ((long)*(int *)((long)pvVar12 + 0x24) * (long)*(int *)(lVar2 + 8) +
                            lVar9) * 8);
          uVar7 = uVar3 & 0xfffffffffffffffe;
          lVar2 = *(long *)(uVar7 + 0x28);
          uVar7 = *(ulong *)(*(long *)(lVar2 + 0x20) +
                            (long)*(int *)(uVar7 + 0x24) * (long)*(int *)(lVar2 + 0x18) * 8);
          uVar8 = uVar4 & 0xfffffffffffffffe;
          lVar2 = *(long *)(uVar8 + 0x28);
          uVar8 = *(ulong *)(*(long *)(lVar2 + 0x20) +
                            (long)*(int *)(uVar8 + 0x24) * (long)*(int *)(lVar2 + 0x18) * 8);
          uVar10 = ((uint)uVar7 ^ *(uint *)((long)pvVar11 + 0x18) >> 3) & 1;
          uVar5 = (uint)uVar3 & 1;
          fComplL = uVar10 ^ uVar5;
          fComplR = ((uint)uVar4 ^ *(uint *)((long)pvVar12 + 0x18) >> 3 ^ (uint)uVar8) & 1;
          pOld = (Aig_Obj_t *)(uVar7 & 0xfffffffffffffffe);
          pNew = (Aig_Obj_t *)(uVar8 & 0xfffffffffffffffe);
          if (pOld == pNew) {
            if ((fComplL != fComplR) &&
               (((*(uint *)&pOld->field_0x18 & 7) != 1 || (uVar10 == uVar5)))) {
LAB_005ee36a:
              if (pBmc->vImps->nSize <= lVar13) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              pBmc->vImps->pArray[lVar13] = 0;
              break;
            }
          }
          else {
            iVar6 = Fra_NodesAreImp(p,pOld,pNew,fComplL,fComplR);
            if (iVar6 != 1) goto LAB_005ee36a;
          }
        }
      }
      lVar13 = lVar13 + 1;
      vImps = pBmc->vImps;
    } while (lVar13 < vImps->nSize);
  }
  Fra_ImpCompactArray(vImps);
  return;
}

Assistant:

void Fra_BmcFilterImplications( Fra_Man_t * p, Fra_Bmc_t * pBmc )
{
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftT, * pRightT;
    Aig_Obj_t * pLeftF, * pRightF;
    int i, f, Imp, Left, Right;
    int fComplL, fComplR;
    assert( p->nFramesAll == 1 );
    assert( p->pManAig == pBmc->pAigFrames );
    Vec_IntForEachEntry( pBmc->vImps, Imp, i )
    {
        if ( Imp == 0 )
            continue;
        Left  = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        // get the corresponding nodes
        pLeft  = Aig_ManObj( pBmc->pAig, Left );
        pRight = Aig_ManObj( pBmc->pAig, Right );
        // iterate through the timeframes
        for ( f = pBmc->nPref; f < pBmc->nFramesAll; f++ )
        {
            // get timeframe nodes
            pLeftT  = Bmc_ObjFrames( pLeft, f );
            pRightT = Bmc_ObjFrames( pRight, f );
            // get the corresponding FRAIG nodes
            pLeftF  = Fra_ObjFraig( Aig_Regular(pLeftT), 0 );
            pRightF = Fra_ObjFraig( Aig_Regular(pRightT), 0 );
            // get the complemented attributes
            fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF) ^ Aig_IsComplement(pLeftT);
            fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF) ^ Aig_IsComplement(pRightT);
            // check equality
            if ( Aig_Regular(pLeftF) == Aig_Regular(pRightF) )
            {
                if ( fComplL == fComplR ) // x => x  - always true
                    continue;
                assert( fComplL != fComplR );
                // consider 4 possibilities:
                // NOT(1) => 1    or   0 => 1  - always true
                // 1 => NOT(1)    or   1 => 0  - never true
                // NOT(x) => x    or   x       - not always true
                // x => NOT(x)    or   NOT(x)  - not always true
                if ( Aig_ObjIsConst1(Aig_Regular(pLeftF)) && fComplL ) // proved implication
                    continue;
                // disproved implication
                Vec_IntWriteEntry( pBmc->vImps, i, 0 ); 
                break;
            }
            // check the implication 
            if ( Fra_NodesAreImp( p, Aig_Regular(pLeftF), Aig_Regular(pRightF), fComplL, fComplR ) != 1 )
            {
                Vec_IntWriteEntry( pBmc->vImps, i, 0 );
                break;
            }
        }
    }
    Fra_ImpCompactArray( pBmc->vImps );
}